

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Evaluator.cpp
# Opt level: O0

Object * punky::eval::Evaluator::eval_infix_expr
                   (Object *__return_storage_ptr__,TokenType *op,Object *left,Object *right)

{
  Object *right_local;
  Object *left_local;
  TokenType *op_local;
  
  if ((left->m_type == Int) && (right->m_type == Int)) {
    eval_int_infix_expr(__return_storage_ptr__,op,left,right);
  }
  else if ((left->m_type == Boolean) && (right->m_type == Boolean)) {
    eval_bool_infix_expr(__return_storage_ptr__,op,left,right);
  }
  else if (left->m_type == right->m_type) {
    unknown_op_error(__return_storage_ptr__,op,left,right);
  }
  else {
    type_mismatch_error(__return_storage_ptr__,op,left,right);
  }
  return __return_storage_ptr__;
}

Assistant:

Object Evaluator::eval_infix_expr(const TokenType& op, const Object& left, const Object& right)
{
    if (left.m_type == ObjectType::Int && right.m_type == ObjectType::Int)
        return eval_int_infix_expr(op, left, right);

    if (left.m_type == ObjectType::Boolean && right.m_type == ObjectType::Boolean)
        return eval_bool_infix_expr(op, left, right);

    if (left.m_type != right.m_type)
        return type_mismatch_error(op, left, right);

    return unknown_op_error(op, left, right);
}